

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRDisplayNode::auditValues
          (VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *treeData)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference ppVVar4;
  string *in_RDX;
  VRDisplayNode *in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  const_iterator it_2;
  const_iterator it_1;
  const_iterator it;
  VRDisplayNode *in_stack_fffffffffffffbc8;
  key_type *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  value_type *in_stack_fffffffffffffbe8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  key_type local_3d0;
  VRDisplayNode **local_3a0;
  VRDisplayNode **local_398;
  __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_390;
  _List_node_base *local_388;
  undefined1 local_379 [33];
  undefined4 local_358;
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffdff;
  VRError *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe10;
  int *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  string *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  char local_1b1 [33];
  undefined1 local_190 [32];
  undefined1 local_170 [240];
  _Self local_80;
  _Self local_78;
  iterator local_70;
  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_68;
  iterator local_60;
  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  local_58;
  _List_node_base *local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  iterator local_38;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator local_28;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  VRDisplayNode *this_00;
  
  this_00 = in_RSI;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbc8);
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator
            ((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffe0,&local_28);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbc8);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_30,&local_38);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_30);
    if (!bVar1) break;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffbd0);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    local_48 = (_Base_ptr)pVar5.first._M_node;
    local_40 = pVar5.second;
    local_50 = (_List_node_base *)
               std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&stack0xffffffffffffffe0,0);
  }
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_fffffffffffffbc8);
  std::
  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  ::_List_const_iterator(&local_58,&local_60);
  do {
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_fffffffffffffbc8);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::_List_const_iterator(&local_68,&local_70);
    bVar1 = std::operator!=(&local_58,&local_68);
    if (!bVar1) {
      local_398 = (VRDisplayNode **)
                  std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::
                  begin((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                        in_stack_fffffffffffffbc8);
      __gnu_cxx::
      __normal_iterator<MinVR::VRDisplayNode*const*,std::vector<MinVR::VRDisplayNode*,std::allocator<MinVR::VRDisplayNode*>>>
      ::__normal_iterator<MinVR::VRDisplayNode**>
                ((__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  *)in_stack_fffffffffffffbd0,
                 (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  *)in_stack_fffffffffffffbc8);
      while( true ) {
        local_3a0 = (VRDisplayNode **)
                    std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::
                    end((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                        in_stack_fffffffffffffbc8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)in_stack_fffffffffffffbd0,
                           (__normal_iterator<MinVR::VRDisplayNode_**,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                            *)in_stack_fffffffffffffbc8);
        if (!bVar1) break;
        ppVVar4 = __gnu_cxx::
                  __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  ::operator*(&local_390);
        in_stack_fffffffffffffbc8 = *ppVVar4;
        in_stack_fffffffffffffbd0 = &local_3d0;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbd0,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbc8);
        auditValues(this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_RDX,(string *)in_stack_ffffffffffffffe0._M_node);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x16e7e8);
        __gnu_cxx::
        __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
        ::operator++((__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                      *)in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      }
      return;
    }
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *)in_stack_fffffffffffffbd0);
    local_78._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    local_80._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbc8);
    bVar1 = std::operator==(&local_78,&local_80);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing value in display node tree:");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(poVar2,in_RDX);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      ppVar3 = std::
               _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
               ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                             *)in_stack_fffffffffffffbd0);
      if ((ppVar3->second & 1U) != 0) {
        uVar6 = 1;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0xa8);
        std::
        _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
        ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                      *)in_stack_fffffffffffffbd0);
        std::operator+((char *)in_RSI,__rhs);
        std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
        (**(code **)(*in_RDI + 0x10))(local_170);
        std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
        (**(code **)(*in_RDI + 0x18))(local_190);
        std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
        __s = local_1b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (__rhs,__s,(allocator<char> *)in_stack_fffffffffffffc00);
        __a = (allocator<char> *)&stack0xfffffffffffffe27;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(__rhs,__s,__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(__rhs,__s,__a);
        VRError::VRError(in_stack_fffffffffffffe00,
                         (string *)
                         CONCAT17(in_stack_fffffffffffffdff,
                                  CONCAT16(uVar6,in_stack_fffffffffffffdf8)),
                         in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        __cxa_throw(__rhs,&VRError::typeinfo,VRError::~VRError);
      }
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
      ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                    *)in_stack_fffffffffffffbd0);
      std::operator+((char *)in_RSI,in_stack_fffffffffffffc10);
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      (**(code **)(*in_RDI + 0x10))(local_2e8);
      std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      (**(code **)(*in_RDI + 0x18))(local_308);
      std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                 (allocator<char> *)in_stack_fffffffffffffc00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                 (allocator<char> *)in_stack_fffffffffffffc00);
      local_358 = 0x9e;
      in_stack_fffffffffffffbd8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_379;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
                 (allocator<char> *)in_stack_fffffffffffffc00);
      VRError::VRWarning(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         (string *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::__cxx11::string::~string((string *)(local_379 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_379);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator(&local_351);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator(&local_329);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
    }
    local_388 = (_List_node_base *)
                std::
                _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                ::operator++(&local_58,0);
  } while( true );
}

Assistant:

void VRDisplayNode::auditValues(std::set<std::string> valuesSet,
                                const std::string &treeData) {

  //std::cerr << " checking: " << _name << std::endl;

  // Add the values supplied by this node to the set of values against which we
  // will check the values needed by this node.
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {

    //std:: cerr << "    adding: " << *it << std::endl;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }

  // Run through all the valuesNeeded and see if they are in valuesSet.
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {

    //std:: cerr << "    needing: " << it->first << std::endl;

    // If the name is not in the value set, print the treeData and throw an error.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      std::cerr << "Missing value in display node tree:" << std::endl
                << treeData << std::endl;

      // We only bomb if the value is required.
      if (it->second) {
        VRERROR("Necessary data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                "Review the construction of the display node tree in your configuration file.");
      } else {
        VRWARNING("Optional data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                  "Review the construction of the display node tree in your configuration file.");
      }
    }
  }

  // Recursively audit the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    (*it)->auditValues(valuesSet, treeData);
  }
}